

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

shared_ptr<notch::core::SoftmaxWithLoss> __thiscall notch::core::MakeLayer::softmax(MakeLayer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  MakeLayer *in_RSI;
  shared_ptr<notch::core::SoftmaxWithLoss> sVar2;
  undefined1 local_41;
  string local_40;
  
  if (in_RSI->nInputs == 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"a SoftmaxWithLoss layer","");
    logic_error(in_RSI,&local_40);
    _Var1._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
      _Var1._M_pi = extraout_RDX_01;
    }
    this->nInputs = 0;
    this->nOutputs = 0;
  }
  else {
    this->nInputs = 0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<notch::core::SoftmaxWithLoss,std::allocator<notch::core::SoftmaxWithLoss>,unsigned_long&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->nOutputs,
               (SoftmaxWithLoss **)this,(allocator<notch::core::SoftmaxWithLoss> *)&local_41,
               &in_RSI->nInputs);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<notch::core::SoftmaxWithLoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<notch::core::SoftmaxWithLoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<notch::core::SoftmaxWithLoss>)
         sVar2.super___shared_ptr<notch::core::SoftmaxWithLoss,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SoftmaxWithLoss> softmax() {
        if (nInputs) {
            return std::make_shared<SoftmaxWithLoss>(nInputs);
        } else {
            logic_error("a SoftmaxWithLoss layer");
            return nullptr; // unreachable
       }
    }